

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManDupAppendShare(Gia_Man_t *pNew,Gia_Man_t *pTwo)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  ulong uVar3;
  int v;
  
  if (pNew->vCis->nSize != pTwo->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(pTwo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x3f1,"void Gia_ManDupAppendShare(Gia_Man_t *, Gia_Man_t *)");
  }
  if ((pNew->vHTable).nSize == 0) {
    Gia_ManHashStart(pNew);
  }
  pTwo->pObjs->Value = 0;
  v = 1;
  do {
    if (pTwo->nObjs <= v) {
      return;
    }
    pObj = Gia_ManObj(pTwo,v);
    if (pObj == (Gia_Obj_t *)0x0) {
      return;
    }
    uVar2 = (uint)*(ulong *)pObj;
    uVar3 = *(ulong *)pObj & 0x1fffffff;
    if (uVar3 == 0x1fffffff || (int)uVar2 < 0) {
      if ((~uVar2 & 0x9fffffff) == 0) {
        iVar1 = Gia_ObjCioId(pObj);
        pObj_00 = Gia_ManCi(pNew,iVar1);
        uVar2 = Gia_Obj2Lit(pNew,pObj_00);
        goto LAB_001d5f73;
      }
      if ((int)uVar2 < 0 && (int)uVar3 != 0x1fffffff) {
        iVar1 = Gia_ObjFanin0Copy(pObj);
        uVar2 = Gia_ManAppendCo(pNew,iVar1);
        goto LAB_001d5f73;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar2 = Gia_ManHashAnd(pNew,iVar1,iLit1);
LAB_001d5f73:
      pObj->Value = uVar2;
    }
    v = v + 1;
  } while( true );
}

Assistant:

void Gia_ManDupAppendShare( Gia_Man_t * pNew, Gia_Man_t * pTwo )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(pTwo) );
    if ( Vec_IntSize(&pNew->vHTable) == 0 )
        Gia_ManHashStart( pNew );
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachObj1( pTwo, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_Obj2Lit( pNew, Gia_ManCi( pNew, Gia_ObjCioId(pObj) ) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
}